

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretbox.h
# Opt level: O2

void hydro_secretbox_setup
               (uint8_t *buf,uint64_t msg_id,char *ctx,uint8_t *key,uint8_t *iv,uint8_t key_tag)

{
  uint8_t msg_id_le [8];
  
  mem_zero(buf,0x30);
  buf[0] = '\x06';
  buf[1] = 's';
  buf[2] = 'b';
  buf[3] = 'x';
  buf[4] = '2';
  buf[5] = '5';
  buf[6] = '6';
  buf[7] = '\b';
  *(undefined8 *)(buf + 8) = *(undefined8 *)ctx;
  gimli_core_u8(buf,'\x01');
  mem_xor(buf,key,0x10);
  gimli_core_u8(buf,key_tag);
  mem_xor(buf,key + 0x10,0x10);
  gimli_core_u8(buf,key_tag);
  *buf = *buf ^ 0x14;
  mem_xor(buf + 1,iv,0xf);
  gimli_core_u8(buf,'\x01');
  mem_xor(buf,iv + 0xf,5);
  msg_id_le = (uint8_t  [8])msg_id;
  mem_xor(buf + 4,msg_id_le,8);
  gimli_core_u8(buf,'\x01');
  return;
}

Assistant:

static void
hydro_secretbox_setup(uint8_t buf[gimli_BLOCKBYTES], uint64_t msg_id,
                      const char    ctx[hydro_secretbox_CONTEXTBYTES],
                      const uint8_t key[hydro_secretbox_KEYBYTES],
                      const uint8_t iv[hydro_secretbox_IVBYTES], uint8_t key_tag)
{
    static const uint8_t prefix[] = { 6, 's', 'b', 'x', '2', '5', '6', 8 };
    uint8_t              msg_id_le[8];

    mem_zero(buf, gimli_BLOCKBYTES);
    COMPILER_ASSERT(hydro_secretbox_CONTEXTBYTES == 8);
    COMPILER_ASSERT(sizeof prefix + hydro_secretbox_CONTEXTBYTES <= gimli_RATE);
    memcpy(buf, prefix, sizeof prefix);
    memcpy(buf + sizeof prefix, ctx, hydro_secretbox_CONTEXTBYTES);
    COMPILER_ASSERT(sizeof prefix + hydro_secretbox_CONTEXTBYTES == gimli_RATE);
    gimli_core_u8(buf, gimli_TAG_HEADER);

    COMPILER_ASSERT(hydro_secretbox_KEYBYTES == 2 * gimli_RATE);
    mem_xor(buf, key, gimli_RATE);
    gimli_core_u8(buf, key_tag);
    mem_xor(buf, key + gimli_RATE, gimli_RATE);
    gimli_core_u8(buf, key_tag);

    COMPILER_ASSERT(hydro_secretbox_IVBYTES < gimli_RATE * 2);
    buf[0] ^= hydro_secretbox_IVBYTES;
    mem_xor(&buf[1], iv, gimli_RATE - 1);
    gimli_core_u8(buf, gimli_TAG_HEADER);
    mem_xor(buf, iv + gimli_RATE - 1, hydro_secretbox_IVBYTES - (gimli_RATE - 1));
    STORE64_LE(msg_id_le, msg_id);
    COMPILER_ASSERT(hydro_secretbox_IVBYTES - gimli_RATE + 8 <= gimli_RATE);
    mem_xor(buf + hydro_secretbox_IVBYTES - gimli_RATE, msg_id_le, 8);
    gimli_core_u8(buf, gimli_TAG_HEADER);
}